

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

uint __thiscall QPDFObjectHandle::getUIntValueAsUInt(QPDFObjectHandle *this)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  longlong local_20;
  longlong v;
  QPDFObjectHandle *this_local;
  
  v = (longlong)this;
  local_20 = getIntValue(this);
  if (local_20 < 0) {
    QTC::TC("qpdf","QPDFObjectHandle uint uint returning 0",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unsigned integer value request for negative number; returning 0"
               ,&local_41);
    warnIfPossible(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._4_4_ = 0;
  }
  else if (local_20 < 0x100000000) {
    this_local._4_4_ = (uint)local_20;
  }
  else {
    QTC::TC("qpdf","QPDFObjectHandle uint returning UINT_MAX",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "requested value of unsigned integer is too big; returning UINT_MAX",&local_79);
    warnIfPossible(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int
QPDFObjectHandle::getUIntValueAsUInt() const
{
    long long v = getIntValue();
    if (v < 0) {
        QTC::TC("qpdf", "QPDFObjectHandle uint uint returning 0");
        warnIfPossible("unsigned integer value request for negative number; returning 0");
        return 0;
    } else if (v > UINT_MAX) {
        QTC::TC("qpdf", "QPDFObjectHandle uint returning UINT_MAX");
        warnIfPossible("requested value of unsigned integer is too big; returning UINT_MAX");
        return UINT_MAX;
    } else {
        return static_cast<unsigned int>(v);
    }
}